

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

void path_insert(ps_astar_t *nbest,ps_latpath_t *newpath,int32 total_score)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ps_latpath_t **pppVar4;
  ps_latpath_s *ppVar5;
  uint uVar6;
  ps_latpath_s *elem;
  
  elem = nbest->path_list;
  if (elem == (ps_latpath_s *)0x0) {
    newpath->next = (ps_latpath_s *)0x0;
    nbest->path_list = newpath;
    uVar3 = 0;
LAB_00110c1d:
    pppVar4 = &nbest->path_tail;
  }
  else {
    if ((elem->node->info).fanin + elem->score < total_score) {
      uVar3 = 0;
      ppVar5 = (ps_latpath_s *)0x0;
    }
    else {
      uVar6 = 0;
      do {
        ppVar5 = elem;
        uVar3 = uVar6 + 1;
        elem = ppVar5->next;
        if ((0x1f2 < uVar6) || (elem == (ps_latpath_s *)0x0)) {
          if (0x1f2 < uVar6) {
            nbest->path_tail = ppVar5;
            ppVar5->next = (ps_latpath_s *)0x0;
            nbest->n_path = 500;
            __listelem_free__(nbest->latpath_alloc,newpath,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                              ,0x66e);
            nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
            while (elem != (ps_latpath_s *)0x0) {
              ppVar5 = elem->next;
              __listelem_free__(nbest->latpath_alloc,elem,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                ,0x673);
              nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
              elem = ppVar5;
            }
            return;
          }
          newpath->next = elem;
          ppVar5->next = newpath;
          if (elem == (ps_latpath_s *)0x0) goto LAB_00110c1d;
          goto LAB_00110c64;
        }
        uVar6 = uVar3;
      } while (total_score <= (elem->node->info).fanin + elem->score);
    }
    newpath->next = elem;
    pppVar4 = &ppVar5->next;
    if (ppVar5 == (ps_latpath_s *)0x0) {
      pppVar4 = &nbest->path_list;
    }
  }
  *pppVar4 = newpath;
LAB_00110c64:
  nbest->n_hyp_insert = nbest->n_hyp_insert + 1;
  uVar1 = nbest->insert_depth;
  uVar2 = nbest->n_path;
  nbest->insert_depth = uVar3 + uVar1;
  nbest->n_path = uVar2 + 1;
  return;
}

Assistant:

static void
path_insert(ps_astar_t *nbest, ps_latpath_t *newpath, int32 total_score)
{
    ps_latpath_t *prev, *p;
    int32 i;

    prev = NULL;
    for (i = 0, p = nbest->path_list; (i < MAX_PATHS) && p; p = p->next, i++) {
        if ((p->score + p->node->info.rem_score) < total_score)
            break;
        prev = p;
    }

    /* newpath should be inserted between prev and p */
    if (i < MAX_PATHS) {
        /* Insert new partial hyp */
        newpath->next = p;
        if (!prev)
            nbest->path_list = newpath;
        else
            prev->next = newpath;
        if (!p)
            nbest->path_tail = newpath;

        nbest->n_path++;
        nbest->n_hyp_insert++;
        nbest->insert_depth += i;
    }
    else {
        /* newpath score too low; reject it and also prune paths beyond MAX_PATHS */
        nbest->path_tail = prev;
        prev->next = NULL;
        nbest->n_path = MAX_PATHS;
        listelem_free(nbest->latpath_alloc, newpath);

        nbest->n_hyp_reject++;
        for (; p; p = newpath) {
            newpath = p->next;
            listelem_free(nbest->latpath_alloc, p);
            nbest->n_hyp_reject++;
        }
    }
}